

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O1

Value * cmFileAPIToolchainsDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined8 *puVar1;
  int iVar2;
  Value *pVVar3;
  allocator_type *__a;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  long lVar4;
  ToolchainVariable *in_R8;
  cmMakefile *mf;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l_00;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  bool local_188;
  undefined2 *local_180;
  undefined8 local_178;
  undefined2 local_170;
  undefined1 uStack_16e;
  undefined4 uStack_16d;
  undefined1 uStack_169;
  undefined7 uStack_168;
  undefined1 local_161;
  undefined7 *local_160;
  undefined8 local_158;
  undefined7 local_150;
  undefined4 uStack_149;
  undefined1 local_145;
  undefined1 local_140;
  undefined4 *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined3 uStack_124;
  undefined1 local_121;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [6];
  undefined1 uStack_da;
  undefined1 local_d3;
  undefined7 *local_d0;
  undefined8 local_c8;
  undefined7 local_c0;
  undefined1 uStack_b9;
  undefined7 uStack_b8;
  undefined2 local_b1;
  undefined1 **local_a8;
  cmMakefile *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  Value local_80;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_80,arrayValue);
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_98,
             (fileAPI->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_a0 = (cmMakefile *)
             local_98.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = &local_f0;
    mf = (cmMakefile *)
         local_98.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           CompilerVariables == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::CompilerVariables
                                     ), iVar2 != 0)) {
        local_1c8._0_8_ = local_1c8 + 0x10;
        local_1c8._16_4_ = 0x68746170;
        local_1c8._8_8_ = 4;
        local_1c8[0x14] = '\0';
        local_1a8._M_p = (pointer)&local_198;
        local_198._M_allocated_capacity = 0x52454c49504d4f43;
        local_1a0 = 8;
        local_198._M_local_buf[8] = '\0';
        local_188 = false;
        local_180 = &local_170;
        local_170 = 0x6469;
        local_178 = 2;
        uStack_16e = 0;
        local_160 = &local_150;
        local_150 = 0x454c49504d4f43;
        uStack_149 = 0x44495f52;
        local_158 = 0xb;
        local_145 = 0;
        local_140 = 0;
        uStack_124 = 0x6e6f69;
        local_128 = 0x73726576;
        local_130 = 7;
        local_121 = 0;
        local_138 = &local_128;
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"COMPILER_VERSION","");
        local_f8 = 0;
        local_e8 = 6;
        uStack_da = 0;
        uStack_b8 = 0x5445475241545f;
        local_c0 = 0x454c49504d4f43;
        uStack_b9 = 0x52;
        local_c8 = 0xf;
        local_b1 = 0;
        __l._M_len = extraout_RDX;
        __l._M_array = (iterator)local_1c8;
        local_f0 = local_e0;
        local_d0 = &local_c0;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerVariables,__l,(allocator_type *)0x52454c49504d4f43);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_1cfc5e7::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_1c8 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerVariables);
      }
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           CompilerImplicitVariables == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::
                                       CompilerImplicitVariables), iVar2 != 0)) {
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"includeDirectories","")
        ;
        local_1a8._M_p = (pointer)&local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"IMPLICIT_INCLUDE_DIRECTORIES","");
        local_188 = true;
        local_180 = &local_170;
        uStack_168 = 0x736569726f7463;
        local_170 = 0x696c;
        uStack_16e = 0x6e;
        uStack_16d = 0x7269446b;
        uStack_169 = 0x65;
        local_178 = 0xf;
        local_161 = 0;
        local_160 = &local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"IMPLICIT_LINK_DIRECTORIES","");
        local_140 = 1;
        local_138 = &local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"linkFrameworkDirectories","");
        local_118[0] = local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"IMPLICIT_LINK_FRAMEWORK_DIRECTORIES","");
        local_f8 = 1;
        __a = (allocator_type *)0x7262694c6b6e696c;
        local_e8 = 0xd;
        local_d3 = 0;
        local_f0 = local_e0;
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"IMPLICIT_LINK_LIBRARIES","");
        local_b1 = CONCAT11(1,(undefined1)local_b1);
        __l_00._M_len = extraout_RDX_00;
        __l_00._M_array = (iterator)local_1c8;
        std::
        vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
        ::vector((vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    CompilerImplicitVariables,__l_00,__a);
        lVar4 = 0xd8;
        do {
          anon_unknown.dwarf_1cfc5e7::ToolchainVariable::~ToolchainVariable
                    ((ToolchainVariable *)(local_1c8 + lVar4));
          lVar4 = lVar4 + -0x48;
        } while (lVar4 != -0x48);
        __cxa_atexit(std::
                     vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                     ::~vector,
                     (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                     CompilerImplicitVariables,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::CompilerImplicitVariables);
      }
      if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
           SourceFileExtensionsVariable == '\0') &&
         (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                       DumpToolchain(std::__cxx11::string_const&)::
                                       SourceFileExtensionsVariable), iVar2 != 0)) {
        (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
        SourceFileExtensionsVariable = &DAT_0097bf00;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                    SourceFileExtensionsVariable,"sourceFileExtensions","");
        _DAT_0097bf10 = &DAT_0097bf20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&DAT_0097bf10,"SOURCE_FILE_EXTENSIONS","");
        DAT_0097bf30 = 1;
        __cxa_atexit(anon_unknown.dwarf_1cfc5e7::ToolchainVariable::~ToolchainVariable,
                     &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)
                      ::SourceFileExtensionsVariable,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                             DumpToolchain(std::__cxx11::string_const&)::
                             SourceFileExtensionsVariable);
      }
      puVar1 = *(undefined8 **)
                &(((fileAPI->CMakeInstance->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
      ;
      Json::Value::Value((Value *)&stack0xffffffffffffffa8,objectValue);
      Json::Value::Value((Value *)local_1c8,(String *)mf);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"language");
      Json::Value::operator=(pVVar3,(Value *)local_1c8);
      Json::Value::~Value((Value *)local_1c8);
      anon_unknown.dwarf_1cfc5e7::Toolchains::DumpToolchainVariables
                ((Value *)local_1c8,(Toolchains *)*puVar1,mf,
                 (string *)
                 (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                 CompilerVariables,
                 (vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)in_R8);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
      Json::Value::operator=(pVVar3,(Value *)local_1c8);
      Json::Value::~Value((Value *)local_1c8);
      anon_unknown.dwarf_1cfc5e7::Toolchains::DumpToolchainVariables
                ((Value *)local_1c8,(Toolchains *)*puVar1,mf,
                 (string *)
                 (anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                 CompilerImplicitVariables,
                 (vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                  *)in_R8);
      pVVar3 = Json::Value::operator[]((Value *)&stack0xffffffffffffffa8,"compiler");
      pVVar3 = Json::Value::operator[](pVVar3,"implicit");
      Json::Value::operator=(pVVar3,(Value *)local_1c8);
      Json::Value::~Value((Value *)local_1c8);
      anon_unknown.dwarf_1cfc5e7::Toolchains::DumpToolchainVariable
                ((Toolchains *)*puVar1,(cmMakefile *)&stack0xffffffffffffffa8,(Value *)mf,
                 (string *)
                 &(anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
                  SourceFileExtensionsVariable,in_R8);
      Json::Value::append(&local_80,(Value *)&stack0xffffffffffffffa8);
      Json::Value::~Value((Value *)&stack0xffffffffffffffa8);
      mf = (cmMakefile *)
           &(mf->FindPackageRootPathStack).
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
    } while (mf != local_a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"toolchains");
  Json::Value::operator=(pVVar3,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIToolchainsDump(cmFileAPI& fileAPI, unsigned long version)
{
  Toolchains toolchains(fileAPI, version);
  return toolchains.Dump();
}